

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  char *extension;
  int iVar2;
  uint uVar3;
  GLFWwindow *handle;
  long lVar4;
  GLint value;
  int height;
  int width;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x20004,0);
    handle = glfwCreateWindow(0x280,0x1e0,"Defaults",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwGetFramebufferSize(handle,&width,&height);
      printf("framebuffer size: %ix%i\n",(ulong)(uint)width,(ulong)(uint)height);
      for (lVar4 = 8; lVar4 != 0x58; lVar4 = lVar4 + 0x10) {
        uVar1 = *(undefined8 *)((long)&glfw_attribs[0].attrib + lVar4);
        uVar3 = glfwGetWindowAttrib(handle,*(int *)((long)&__do_global_dtors_aux_fini_array_entry +
                                                   lVar4));
        printf("%s: %i\n",uVar1,(ulong)uVar3);
      }
      lVar4 = 0x10;
      do {
        if (lVar4 == 0xd0) {
          glfwDestroyWindow(handle);
          glfwTerminate();
          exit(0);
        }
        value = 0;
        uVar1 = *(undefined8 *)((long)&gl_attribs[0].attrib + lVar4);
        extension = *(char **)((long)&glfw_attribs[5].name + lVar4);
        if (extension == (char *)0x0) {
LAB_00106b5a:
          glGetIntegerv(*(undefined4 *)((long)&glfw_attribs[5].attrib + lVar4),&value);
          printf("%s: %i\n",uVar1,(ulong)(uint)value);
        }
        else {
          iVar2 = glfwExtensionSupported(extension);
          if (iVar2 != 0) goto LAB_00106b5a;
        }
        lVar4 = lVar4 + 0x18;
      } while( true );
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i, width, height;
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(640, 480, "Defaults", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwGetFramebufferSize(window, &width, &height);

    printf("framebuffer size: %ix%i\n", width, height);

    for (i = 0;  glfw_attribs[i].name;   i++)
    {
        printf("%s: %i\n",
               glfw_attribs[i].name,
               glfwGetWindowAttrib(window, glfw_attribs[i].attrib));
    }

    for (i = 0;  gl_attribs[i].name;   i++)
    {
        GLint value = 0;

        if (gl_attribs[i].ext)
        {
            if (!glfwExtensionSupported(gl_attribs[i].ext))
                continue;
        }

        glGetIntegerv(gl_attribs[i].attrib, &value);

        printf("%s: %i\n", gl_attribs[i].name, value);
    }

    glfwDestroyWindow(window);
    window = NULL;

    glfwTerminate();
    exit(EXIT_SUCCESS);
}